

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O2

void GameDraw(void)

{
  ALLEGRO_FONT *pAVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  float fVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ALLEGRO_BITMAP *pAVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  undefined4 uVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double in_XMM3_Qa;
  double dVar19;
  undefined8 in_XMM6_Qa;
  double dStack_140;
  ALLEGRO_TRANSFORM transform;
  ALLEGRO_VERTEX Points [4];
  
  al_identity_transform(&transform);
  al_scale_transform((float)screen_height / 480.0,(float)screen_height / 480.0,&transform);
  al_use_transform(&transform);
  dVar15 = 480.0;
  fVar5 = ((float)screen_width * 480.0) / (float)screen_height;
  dVar19 = (double)fVar5;
  for (uVar10 = 0x77f; 0x3cf < uVar10; uVar10 = uVar10 - 1) {
    iVar6 = al_fixmul();
    dVar18 = (double)iVar6 * 1.52587890625e-05;
    if ((-261.0 < dVar18) && (dVar18 < -5.0)) {
      dVar2 = ((double)((int)(dVar18 * 65536.0) & 0xffffff) * 1.52587890625e-05 + -1.0) *
              3.141592653589793;
      dVar2 = sin((dVar2 + dVar2) * 8.0 * 0.0078125 + WaveY);
      dVar2 = (dVar2 * -125.0) / dVar18 + (double)(int)uVar10 * 0.25;
      if (dVar2 < dVar15) {
        dVar3 = ceil(dVar2);
        dVar17 = ScrollPos[0] * 0.125 + 64.0 + TexX;
        dVar16 = dVar18 * 4.0 + dVar17;
        in_XMM3_Qa = dVar18 + 5.0;
        set_v(Points,0.0,dVar2,dVar16,in_XMM3_Qa);
        dVar17 = dVar17 - dVar18 * 4.0;
        set_v(Points + 1,dVar19,dVar2,dVar17,in_XMM3_Qa);
        set_v(Points + 2,dVar19,dVar15,dVar17,in_XMM3_Qa);
        set_v(Points + 3,0.0,dVar15,dVar16,in_XMM3_Qa);
        al_draw_prim(Points,0,water,0,4,5);
        dVar15 = dVar3;
      }
    }
  }
  al_set_clipping_rectangle(0,0,screen_width,(int)((dVar15 * (double)screen_height) / 480.0 + 1.0));
  al_clear_to_color((int)cloud_color_0,(int)cloud_color_1);
  pdVar11 = &Clouds[7].y;
  for (lVar12 = 0xe; uVar13 = (undefined4)((ulong)in_XMM6_Qa >> 0x20), lVar12 != 6;
      lVar12 = lVar12 + -1) {
    dVar18 = ((anon_struct_16_2_947320ea *)(pdVar11 + -1))->x + CloudX;
    dVar2 = sin(dVar18);
    iVar6 = al_get_bitmap_width(cloud);
    dVar19 = sin(dVar18);
    dVar3 = dVar19 * 1.4 + (double)iVar6 + dVar18;
    dVar19 = *pdVar11;
    dVar17 = cos(dVar18);
    dVar15 = *pdVar11;
    iVar6 = al_get_bitmap_height(cloud);
    dVar16 = cos(dVar18);
    uVar13 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
    if (0.0 <= dVar3) {
      dVar15 = dVar16 * 1.4 + dVar15 + (double)iVar6;
      dVar19 = -dVar17 * 1.4 + dVar19;
      auVar4._8_4_ = SUB84(dVar19,0);
      auVar4._0_8_ = dVar15;
      auVar4._12_4_ = (int)((ulong)dVar19 >> 0x20);
      dVar18 = dVar18 - dVar2 * 1.4;
      iVar6 = al_get_bitmap_width(cloud);
      iVar7 = al_get_bitmap_height(cloud);
      in_XMM3_Qa = (double)CONCAT44(uVar13,(float)iVar7);
      dStack_140 = auVar4._8_8_;
      in_XMM6_Qa = CONCAT44((int)((ulong)dVar18 >> 0x20),(float)(dVar3 - dVar18));
      al_draw_scaled_bitmap
                (0,0,(float)iVar6,in_XMM3_Qa,(float)dVar18,(float)dStack_140,in_XMM6_Qa,
                 (float)(dVar15 - dStack_140));
    }
    else {
      dVar19 = *(double *)((long)&Clouds[0].x + (ulong)(((uint)lVar12 & 7) << 4));
      iVar6 = al_get_bitmap_width();
      iVar7 = rand();
      ((anon_struct_16_2_947320ea *)(pdVar11 + -1))->x =
           ((double)iVar7 * 32.0) / 2147483647.0 + (double)iVar6 + dVar19 + 8.0;
      iVar6 = rand();
      *pdVar11 = ((double)screen_height * (double)iVar6 * 0.5) / 2147483647.0;
    }
    pdVar11 = pdVar11 + -2;
  }
  al_set_clipping_rectangle(0,0,screen_width,screen_height);
  DrawLevelBackground(Lvl,ScrollPos);
  pAVar9 = GetCurrentBitmap(PlayerAnim);
  iVar6 = al_get_bitmap_width(pAVar9);
  iVar7 = al_get_bitmap_height(pAVar9);
  fVar14 = (float)iVar7 * 0.5;
  dVar19 = (PlayerPos[1] - ScrollPos[1]) + 240.0;
  al_draw_scaled_rotated_bitmap
            ((float)iVar6 * 0.5,fVar14,
             CONCAT44((int)((ulong)(PlayerPos[0] - ScrollPos[0]) >> 0x20),
                      (float)((double)(fVar5 * 0.5) + (PlayerPos[0] - ScrollPos[0]))),
             CONCAT44((int)((ulong)dVar19 >> 0x20),(float)dVar19),0x3f800000,0x3f800000,
             CONCAT44(uVar13,(float)PlayerPos[2]),pAVar9,(uint)KeyFlags >> 5 & 1);
  DrawLevelForeground(Lvl);
  al_identity_transform(&transform);
  al_use_transform(&transform);
  iVar6 = screen_width;
  pAVar1 = (ALLEGRO_FONT *)demo_data[1].dat;
  iVar7 = al_get_text_width(pAVar1,"Items Required: 1000");
  uVar13 = al_map_rgb(0xff,0xff,0xff);
  demo_textprintf(pAVar1,iVar6 - iVar7,8,0x111450,uVar13,(ulong)(uint)RequiredObjectsLeft);
  iVar6 = screen_width;
  pAVar1 = (ALLEGRO_FONT *)demo_data[1].dat;
  iVar7 = al_get_text_width(pAVar1,"Items Remaining: 1000");
  iVar8 = al_get_font_line_height(demo_data[1].dat);
  uVar13 = al_map_rgb(0xff,0xff,0xff);
  demo_textprintf(pAVar1,iVar6 - iVar7,iVar8 + 8,0x111479,uVar13,fVar14,
                  (ulong)(uint)TotalObjectsLeft);
  return;
}

Assistant:

static void GameDraw(void)
{
   ALLEGRO_BITMAP *ch;
   double depth;
   ALLEGRO_VERTEX Points[4];
   ALLEGRO_TRANSFORM transform;
   int chw, chh;
   float w;
   
   al_identity_transform(&transform);
   al_scale_transform(&transform, screen_height / 480.0, screen_height / 480.0);
   al_use_transform(&transform);

   w = screen_width * 480.0 / screen_height;

   /* draw background */
   {
      int c = 480 * 4 - 1;
      double y2, lowy = 480, y1, u;
      double index;

      while (c > 480 * 2 + 15) {

         depth = al_fixtof(al_fixmul(TanTable[c], (int)((ScrollPos[1] - 240) * 4096.0f)));

         if (depth > -261 && depth < -5.0f) {
            int d = ((int)(depth * 65536)) & (256 * 65536 - 1);
            y1 = lowy;
            index = (d / 65536.0 - 1.0) * ALLEGRO_PI * 2 * 8 / 128.0f;

            y2 = c / 4.0 - 125.0f * sin(index + WaveY) / depth;

            if (y2 < lowy) {
               lowy = ceil(y2);

               u = 64 + ScrollPos[0] / 8 + TexX;
               set_v(Points + 0, 0, y2, u + depth * 4, depth + 5);
               set_v(Points + 1, w, y2, u - depth * 4, depth + 5);
               set_v(Points + 2, w, y1, u - depth * 4, depth + 5);
               set_v(Points + 3, 0, y1, u + depth * 4, depth + 5);

               al_draw_prim(Points, NULL, water, 0, 4, ALLEGRO_PRIM_TRIANGLE_FAN);
            }
         }
         c--;
      }

      al_set_clipping_rectangle(0, 0, screen_width, lowy * screen_height / 480 + 1);
      al_clear_to_color(cloud_color);
      DrawClouds();
      al_set_clipping_rectangle(0, 0, screen_width, screen_height);
   }

   /* draw interactable parts of level */
   DrawLevelBackground(Lvl, ScrollPos);

#ifdef DEBUG_EDGES
   solid_mode();
   struct Edge *E = Lvl->AllEdges;

   while (E) {
      line(buffer,
           E->EndPoints[0]->Normal[0] - x + (screen_width >> 1),
           E->EndPoints[0]->Normal[1] - y + (screen_height >> 1),
           E->EndPoints[1]->Normal[0] - x + (screen_width >> 1),
           E->EndPoints[1]->Normal[1] - y + (screen_height >> 1), al_map_rgb(0, 0,
                                                                     0));
      E = E->Next;
   }
#endif

#ifdef DEBUG_OBJECTS
   struct Object *O = Lvl->AllObjects;

   while (O) {
      rect(buffer,
           O->Bounder.TL.Pos[0] - x + (screen_width >> 1),
           O->Bounder.TL.Pos[1] - y + (screen_height >> 1),
           O->Bounder.BR.Pos[0] - x + (screen_width >> 1),
           O->Bounder.BR.Pos[1] - y + (screen_height >> 1), al_map_rgb(0, 0, 0));
      circle(buffer, O->Pos[0] - x + (screen_width >> 1),
             O->Pos[1] - y + (screen_height >> 1), O->ObjType->Radius, al_map_rgb(0,
                                                                          0,
                                                                          0));
      O = O->Next;
   }
#endif

   /* add player sprite */
   ch = GetCurrentBitmap(PlayerAnim);
   chw = al_get_bitmap_width(ch);
   chh = al_get_bitmap_height(ch);

   al_draw_scaled_rotated_bitmap(ch, chw / 2.0, chh / 2.0,
      (PlayerPos[0] - ScrollPos[0]) + w / 2,
      (PlayerPos[1] - ScrollPos[1]) + 480.0 / 2,
      1, 1, PlayerPos[2],
      KeyFlags & KEYFLAG_FLIP ? ALLEGRO_FLIP_HORIZONTAL : 0);

   DrawLevelForeground(Lvl);
   
   al_identity_transform(&transform);
   al_use_transform(&transform);

   /* add status */
   demo_textprintf(demo_font,
                 screen_width - al_get_text_width(demo_font,
                                        "Items Required: 1000"), 8,
                 al_map_rgb(255, 255, 255), "Items Required: %d",
                 RequiredObjectsLeft);
   demo_textprintf(demo_font,
                 screen_width - al_get_text_width(demo_font,
                                        "Items Remaining: 1000"),
                 8 + al_get_font_line_height(demo_font), al_map_rgb(255, 255, 255),
                 "Items Remaining: %d", TotalObjectsLeft);
}